

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

bool __thiscall
QHttp2ProtocolHandler::sendDATA
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,QHttpNetworkReply *reply)

{
  bool bVar1;
  byte bVar2;
  QNonContiguousByteDevice *device;
  
  device = QHttpNetworkRequest::uploadByteDevice
                     ((QHttpNetworkRequest *)(*(long *)&reply->field_0x8 + 0xd8));
  bVar1 = QHttp2Stream::sendDATA((QHttp2Stream *)stream,device,true);
  if (bVar1) {
    bVar2 = ((stream->m_RST_STREAM_sent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged |
            (stream->m_RST_STREAM_received).super__Optional_base<unsigned_int,_true,_true>.
            _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged) ^ 1;
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QHttp2ProtocolHandler::sendDATA(QHttp2Stream *stream, QHttpNetworkReply *reply)
{
    Q_ASSERT(reply);
    QHttpNetworkReplyPrivate *replyPrivate = reply->d_func();
    Q_ASSERT(replyPrivate);
    QHttpNetworkRequest &request = replyPrivate->request;
    Q_ASSERT(request.uploadByteDevice());

    bool startedSending = stream->sendDATA(request.uploadByteDevice(), true);
    return startedSending && !stream->wasReset();
}